

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_pending(event *ev,short event,timeval *tv)

{
  ushort uVar1;
  void *pvVar2;
  __suseconds_t _Var3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  if (ev->ev_base == (event_base *)0x0) {
    uVar4 = 0;
    event_warnx("%s: event has no event_base set.","event_pending");
  }
  else {
    pvVar2 = ev->ev_base->th_base_lock;
    if (pvVar2 != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,pvVar2);
    }
    event_debug_assert_is_setup_(ev);
    uVar1 = (ev->ev_evcallback).evcb_flags;
    uVar4 = 0;
    if ((uVar1 & 2) != 0) {
      uVar4 = (ushort)ev->ev_events & 0x8e;
    }
    if ((uVar1 & 0x28) != 0) {
      uVar4 = uVar4 | (ushort)ev->ev_res;
    }
    uVar4 = uVar1 & 1 | uVar4;
    if ((tv != (timeval *)0x0) && (((ushort)event & uVar4 & 1) != 0)) {
      _Var3 = (ev->ev_timeout).tv_usec;
      lVar6 = (ev->ev_base->tv_clock_diff).tv_sec + (ev->ev_timeout).tv_sec;
      tv->tv_sec = lVar6;
      lVar5 = (ulong)((uint)_Var3 & 0xfffff) + (ev->ev_base->tv_clock_diff).tv_usec;
      tv->tv_usec = lVar5;
      if (999999 < lVar5) {
        tv->tv_sec = lVar6 + 1;
        tv->tv_usec = lVar5 + -1000000;
      }
    }
    pvVar2 = ev->ev_base->th_base_lock;
    if (pvVar2 != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,pvVar2);
    }
    uVar4 = uVar4 & (ushort)event & 0x8f;
  }
  return uVar4;
}

Assistant:

int
event_pending(const struct event *ev, short event, struct timeval *tv)
{
	int flags = 0;

	if (EVUTIL_FAILURE_CHECK(ev->ev_base == NULL)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return 0;
	}

	EVBASE_ACQUIRE_LOCK(ev->ev_base, th_base_lock);
	event_debug_assert_is_setup_(ev);

	if (ev->ev_flags & EVLIST_INSERTED)
		flags |= (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL));
	if (ev->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))
		flags |= ev->ev_res;
	if (ev->ev_flags & EVLIST_TIMEOUT)
		flags |= EV_TIMEOUT;

	event &= (EV_TIMEOUT|EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL);

	/* See if there is a timeout that we should report */
	if (tv != NULL && (flags & event & EV_TIMEOUT)) {
		struct timeval tmp = ev->ev_timeout;
		tmp.tv_usec &= MICROSECONDS_MASK;
		/* correctly remamp to real time */
		evutil_timeradd(&ev->ev_base->tv_clock_diff, &tmp, tv);
	}

	EVBASE_RELEASE_LOCK(ev->ev_base, th_base_lock);

	return (flags & event);
}